

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderRectFilledWithHole
               (ImDrawList *draw_list,ImRect outer,ImRect inner,ImU32 col,float rounding)

{
  bool bVar1;
  ImDrawList *pIVar2;
  float _y;
  float _x;
  uint uVar3;
  uint uVar4;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  float local_38;
  bool fill_D;
  bool fill_U;
  bool fill_R;
  bool fill_L;
  float rounding_local;
  ImU32 col_local;
  ImDrawList *draw_list_local;
  ImRect inner_local;
  ImRect outer_local;
  
  draw_list_local._0_4_ = inner.Min.x;
  inner_local.Max.x = outer.Min.x;
  _x = inner_local.Max.x;
  local_39 = inner_local.Max.x < draw_list_local._0_4_;
  inner_local.Min.x = inner.Max.x;
  outer_local.Min.x = outer.Max.x;
  local_3a = inner_local.Min.x < outer_local.Min.x;
  draw_list_local._4_4_ = inner.Min.y;
  _y = draw_list_local._4_4_;
  inner_local.Max.y = outer.Min.y;
  local_3b = inner_local.Max.y < draw_list_local._4_4_;
  inner_local.Min.y = inner.Max.y;
  outer_local.Min.y = outer.Max.y;
  local_3c = inner_local.Min.y < outer_local.Min.y;
  bVar1 = inner_local.Max.x < draw_list_local._0_4_;
  local_38 = rounding;
  _fill_D = col;
  _rounding_local = draw_list;
  draw_list_local = (ImDrawList *)inner.Min;
  inner_local.Min = inner.Max;
  inner_local.Max = outer.Min;
  if (bVar1) {
    ImVec2::ImVec2(&local_44,_x,_y);
    ImVec2::ImVec2(&local_4c,draw_list_local._0_4_,inner_local.Min.y);
    uVar4 = 0x10;
    if ((local_3b & 1) != 0) {
      uVar4 = 0;
    }
    uVar3 = 0x40;
    if ((local_3c & 1) != 0) {
      uVar3 = 0;
    }
    ImDrawList::AddRectFilled(draw_list,&local_44,&local_4c,_fill_D,local_38,uVar4 | uVar3);
  }
  pIVar2 = _rounding_local;
  if ((local_3a & 1) != 0) {
    ImVec2::ImVec2(&local_54,inner_local.Min.x,draw_list_local._4_4_);
    ImVec2::ImVec2(&local_5c,outer_local.Min.x,inner_local.Min.y);
    uVar4 = 0x20;
    if ((local_3b & 1) != 0) {
      uVar4 = 0;
    }
    uVar3 = 0x80;
    if ((local_3c & 1) != 0) {
      uVar3 = 0;
    }
    ImDrawList::AddRectFilled(pIVar2,&local_54,&local_5c,_fill_D,local_38,uVar4 | uVar3);
  }
  pIVar2 = _rounding_local;
  if ((local_3b & 1) != 0) {
    ImVec2::ImVec2(&local_64,draw_list_local._0_4_,inner_local.Max.y);
    ImVec2::ImVec2(&local_6c,inner_local.Min.x,draw_list_local._4_4_);
    uVar4 = 0x10;
    if ((local_39 & 1) != 0) {
      uVar4 = 0;
    }
    uVar3 = 0x20;
    if ((local_3a & 1) != 0) {
      uVar3 = 0;
    }
    ImDrawList::AddRectFilled(pIVar2,&local_64,&local_6c,_fill_D,local_38,uVar4 | uVar3);
  }
  pIVar2 = _rounding_local;
  if ((local_3c & 1) != 0) {
    ImVec2::ImVec2(&local_74,draw_list_local._0_4_,inner_local.Min.y);
    ImVec2::ImVec2(&local_7c,inner_local.Min.x,outer_local.Min.y);
    uVar4 = 0x40;
    if ((local_39 & 1) != 0) {
      uVar4 = 0;
    }
    uVar3 = 0x80;
    if ((local_3a & 1) != 0) {
      uVar3 = 0;
    }
    ImDrawList::AddRectFilled(pIVar2,&local_74,&local_7c,_fill_D,local_38,uVar4 | uVar3);
  }
  pIVar2 = _rounding_local;
  if (((local_39 & 1) != 0) && ((local_3b & 1) != 0)) {
    ImVec2::ImVec2(&local_84,inner_local.Max.x,inner_local.Max.y);
    ImVec2::ImVec2(&local_8c,draw_list_local._0_4_,draw_list_local._4_4_);
    ImDrawList::AddRectFilled(pIVar2,&local_84,&local_8c,_fill_D,local_38,0x10);
  }
  pIVar2 = _rounding_local;
  if (((local_3a & 1) != 0) && ((local_3b & 1) != 0)) {
    ImVec2::ImVec2(&local_94,inner_local.Min.x,inner_local.Max.y);
    ImVec2::ImVec2(&local_9c,outer_local.Min.x,draw_list_local._4_4_);
    ImDrawList::AddRectFilled(pIVar2,&local_94,&local_9c,_fill_D,local_38,0x20);
  }
  pIVar2 = _rounding_local;
  if (((local_39 & 1) != 0) && ((local_3c & 1) != 0)) {
    ImVec2::ImVec2(&local_a4,inner_local.Max.x,inner_local.Min.y);
    ImVec2::ImVec2(&local_ac,draw_list_local._0_4_,outer_local.Min.y);
    ImDrawList::AddRectFilled(pIVar2,&local_a4,&local_ac,_fill_D,local_38,0x40);
  }
  pIVar2 = _rounding_local;
  if (((local_3a & 1) != 0) && ((local_3c & 1) != 0)) {
    ImVec2::ImVec2(&local_b4,inner_local.Min.x,inner_local.Min.y);
    ImVec2::ImVec2(&local_bc,outer_local.Min.x,outer_local.Min.y);
    ImDrawList::AddRectFilled(pIVar2,&local_b4,&local_bc,_fill_D,local_38,0x80);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledWithHole(ImDrawList* draw_list, ImRect outer, ImRect inner, ImU32 col, float rounding)
{
    const bool fill_L = (inner.Min.x > outer.Min.x);
    const bool fill_R = (inner.Max.x < outer.Max.x);
    const bool fill_U = (inner.Min.y > outer.Min.y);
    const bool fill_D = (inner.Max.y < outer.Max.y);
    if (fill_L) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Min.y), ImVec2(inner.Min.x, inner.Max.y), col, rounding, (fill_U ? 0 : ImDrawFlags_RoundCornersTopLeft)  | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomLeft));
    if (fill_R) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Min.y), ImVec2(outer.Max.x, inner.Max.y), col, rounding, (fill_U ? 0 : ImDrawFlags_RoundCornersTopRight) | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_U) draw_list->AddRectFilled(ImVec2(inner.Min.x, outer.Min.y), ImVec2(inner.Max.x, inner.Min.y), col, rounding, (fill_L ? 0 : ImDrawFlags_RoundCornersTopLeft)  | (fill_R ? 0 : ImDrawFlags_RoundCornersTopRight));
    if (fill_D) draw_list->AddRectFilled(ImVec2(inner.Min.x, inner.Max.y), ImVec2(inner.Max.x, outer.Max.y), col, rounding, (fill_L ? 0 : ImDrawFlags_RoundCornersBottomLeft)  | (fill_R ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_L && fill_U) draw_list->AddRectFilled(ImVec2(outer.Min.x, outer.Min.y), ImVec2(inner.Min.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopLeft);
    if (fill_R && fill_U) draw_list->AddRectFilled(ImVec2(inner.Max.x, outer.Min.y), ImVec2(outer.Max.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopRight);
    if (fill_L && fill_D) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Max.y), ImVec2(inner.Min.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomLeft);
    if (fill_R && fill_D) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Max.y), ImVec2(outer.Max.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomRight);
}